

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec.cc
# Opt level: O0

int pkey_ec_ctrl(EVP_PKEY_CTX *ctx,int type,int p1,void *p2)

{
  undefined8 *puVar1;
  int iVar2;
  EC_GROUP *pEVar3;
  EC_GROUP *group;
  int md_type;
  EVP_MD *md;
  EC_PKEY_CTX *dctx;
  void *p2_local;
  int p1_local;
  int type_local;
  EVP_PKEY_CTX *ctx_local;
  
  puVar1 = (undefined8 *)ctx->data;
  if (type == 1) {
    iVar2 = EVP_MD_type((EVP_MD *)p2);
    if ((((iVar2 == 0x40) || (iVar2 == 0x2a3)) || (iVar2 == 0x2a0)) ||
       ((iVar2 == 0x2a1 || (iVar2 == 0x2a2)))) {
      *puVar1 = p2;
      ctx_local._4_4_ = 1;
    }
    else {
      ERR_put_error(6,0,0x6f,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ec.cc"
                    ,0x88);
      ctx_local._4_4_ = 0;
    }
  }
  else if (type == 2) {
    *(undefined8 *)p2 = *puVar1;
    ctx_local._4_4_ = 1;
  }
  else if (type == 3) {
    ctx_local._4_4_ = 1;
  }
  else if (type == 0x100d) {
    pEVar3 = EC_GROUP_new_by_curve_name(p1);
    if (pEVar3 == (EC_GROUP *)0x0) {
      ctx_local._4_4_ = 0;
    }
    else {
      puVar1[1] = pEVar3;
      ctx_local._4_4_ = 1;
    }
  }
  else {
    ERR_put_error(6,0,0x65,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ec.cc"
                  ,0xa1);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int pkey_ec_ctrl(EVP_PKEY_CTX *ctx, int type, int p1, void *p2) {
  EC_PKEY_CTX *dctx = reinterpret_cast<EC_PKEY_CTX *>(ctx->data);

  switch (type) {
    case EVP_PKEY_CTRL_MD: {
      const EVP_MD *md = reinterpret_cast<const EVP_MD *>(p2);
      int md_type = EVP_MD_type(md);
      if (md_type != NID_sha1 && md_type != NID_sha224 &&
          md_type != NID_sha256 && md_type != NID_sha384 &&
          md_type != NID_sha512) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_DIGEST_TYPE);
        return 0;
      }
      dctx->md = md;
      return 1;
    }

    case EVP_PKEY_CTRL_GET_MD:
      *(const EVP_MD **)p2 = dctx->md;
      return 1;

    case EVP_PKEY_CTRL_PEER_KEY:
      // Default behaviour is OK
      return 1;

    case EVP_PKEY_CTRL_EC_PARAMGEN_CURVE_NID: {
      const EC_GROUP *group = EC_GROUP_new_by_curve_name(p1);
      if (group == NULL) {
        return 0;
      }
      dctx->gen_group = group;
      return 1;
    }

    default:
      OPENSSL_PUT_ERROR(EVP, EVP_R_COMMAND_NOT_SUPPORTED);
      return 0;
  }
}